

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

Status cmsys::SystemTools::CopyADirectory(string *source,string *destination,bool always)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  char *pcVar4;
  CopyStatus CVar5;
  undefined1 local_98 [8];
  string fullDestPath;
  string fullPath;
  size_t fileNum;
  Directory local_30;
  Directory dir;
  bool always_local;
  string *destination_local;
  string *source_local;
  Status status;
  
  dir.Internal._7_1_ = always;
  Status::Status((Status *)&source_local);
  Directory::Directory(&local_30);
  source_local = (string *)Directory::Load(&local_30,source,(string *)0x0);
  bVar1 = Status::IsSuccess((Status *)&source_local);
  if (bVar1) {
    source_local = (string *)MakeDirectory(destination,(mode_t *)0x0);
    bVar1 = Status::IsSuccess((Status *)&source_local);
    if (bVar1) {
      for (fullPath.field_2._8_8_ = 0; uVar3 = Directory::GetNumberOfFiles(&local_30),
          (ulong)fullPath.field_2._8_8_ < uVar3; fullPath.field_2._8_8_ = fullPath.field_2._8_8_ + 1
          ) {
        pcVar4 = Directory::GetFile(&local_30,fullPath.field_2._8_8_);
        iVar2 = strcmp(pcVar4,".");
        if (iVar2 != 0) {
          pcVar4 = Directory::GetFile(&local_30,fullPath.field_2._8_8_);
          iVar2 = strcmp(pcVar4,"..");
          if (iVar2 != 0) {
            std::__cxx11::string::string
                      ((string *)(fullDestPath.field_2._M_local_buf + 8),(string *)source);
            std::__cxx11::string::operator+=((string *)(fullDestPath.field_2._M_local_buf + 8),"/");
            pcVar4 = Directory::GetFile(&local_30,fullPath.field_2._8_8_);
            std::__cxx11::string::operator+=
                      ((string *)(fullDestPath.field_2._M_local_buf + 8),pcVar4);
            bVar1 = FileIsDirectory((string *)((long)&fullDestPath.field_2 + 8));
            if (bVar1) {
              std::__cxx11::string::string((string *)local_98,(string *)destination);
              std::__cxx11::string::operator+=((string *)local_98,"/");
              pcVar4 = Directory::GetFile(&local_30,fullPath.field_2._8_8_);
              std::__cxx11::string::operator+=((string *)local_98,pcVar4);
              source_local = (string *)
                             CopyADirectory((string *)((long)&fullDestPath.field_2 + 8),
                                            (string *)local_98,(bool)(dir.Internal._7_1_ & 1));
              bVar1 = Status::IsSuccess((Status *)&source_local);
              bVar1 = !bVar1;
              std::__cxx11::string::~string((string *)local_98);
              if (!bVar1) goto LAB_00162ce6;
            }
            else {
              CVar5 = CopyAFile((string *)((long)&fullDestPath.field_2 + 8),destination,
                                (bool)(dir.Internal._7_1_ & 1));
              source_local = (string *)CVar5.super_Status;
              bVar1 = Status::IsSuccess((Status *)&source_local);
              if (bVar1) {
LAB_00162ce6:
                bVar1 = false;
              }
              else {
                bVar1 = true;
              }
            }
            std::__cxx11::string::~string((string *)(fullDestPath.field_2._M_local_buf + 8));
            if (bVar1) break;
          }
        }
      }
    }
  }
  Directory::~Directory(&local_30);
  return (Status)source_local;
}

Assistant:

Status SystemTools::CopyADirectory(std::string const& source,
                                   std::string const& destination, bool always)
{
  Status status;
  Directory dir;
  status = dir.Load(source);
  if (!status.IsSuccess()) {
    return status;
  }
  status = SystemTools::MakeDirectory(destination);
  if (!status.IsSuccess()) {
    return status;
  }

  for (size_t fileNum = 0; fileNum < dir.GetNumberOfFiles(); ++fileNum) {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), ".") != 0 &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), "..") != 0) {
      std::string fullPath = source;
      fullPath += "/";
      fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
      if (SystemTools::FileIsDirectory(fullPath)) {
        std::string fullDestPath = destination;
        fullDestPath += "/";
        fullDestPath += dir.GetFile(static_cast<unsigned long>(fileNum));
        status = SystemTools::CopyADirectory(fullPath, fullDestPath, always);
        if (!status.IsSuccess()) {
          return status;
        }
      } else {
        status = SystemTools::CopyAFile(fullPath, destination, always);
        if (!status.IsSuccess()) {
          return status;
        }
      }
    }
  }

  return status;
}